

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O1

ssize_t tunnel_send_callback
                  (nghttp2_session *session,int32_t stream_id,uint8_t *buf,size_t length,
                  uint32_t *data_flags,nghttp2_data_source *source,void *userp)

{
  _Bool _Var1;
  void *pvVar2;
  ssize_t sVar3;
  Curl_easy *data;
  CURLcode local_3c;
  uint32_t *local_38;
  
  if (userp == (void *)0x0) {
    data = (Curl_easy *)0x0;
  }
  else {
    data = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 8);
  }
  if (stream_id == 0) {
    sVar3 = -0x1f5;
  }
  else {
    pvVar2 = nghttp2_session_get_stream_user_data(session,stream_id);
    if (pvVar2 == (void *)0x0) {
      sVar3 = -0x386;
    }
    else {
      local_38 = data_flags;
      sVar3 = Curl_bufq_read((bufq *)((long)pvVar2 + 0x48),buf,length,&local_3c);
      if (sVar3 < 0) {
        sVar3 = -0x386;
        if (local_3c == CURLE_AGAIN) {
          sVar3 = -0x1fc;
        }
      }
      else {
        if ((*(byte *)((long)pvVar2 + 0xa4) & 2) != 0) {
          _Var1 = Curl_bufq_is_empty((bufq *)((long)pvVar2 + 0x48));
          if (_Var1) {
            *local_38 = 1;
          }
        }
        if ((((data != (Curl_easy *)0x0) && (userp != (void *)0x0)) &&
            ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
           (0 < *(int *)(*userp + 0xc))) {
          Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] tunnel_send_callback -> %zd",
                            (ulong)*(uint *)((long)pvVar2 + 0x90),sVar3);
        }
      }
    }
  }
  return sVar3;
}

Assistant:

static ssize_t tunnel_send_callback(nghttp2_session *session,
                                    int32_t stream_id,
                                    uint8_t *buf, size_t length,
                                    uint32_t *data_flags,
                                    nghttp2_data_source *source,
                                    void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  struct tunnel_stream *ts;
  CURLcode result;
  ssize_t nread;

  (void)source;
  (void)data;
  (void)ctx;

  if(!stream_id)
    return NGHTTP2_ERR_INVALID_ARGUMENT;

  ts = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!ts)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  DEBUGASSERT(ts == &ctx->tunnel);

  nread = Curl_bufq_read(&ts->sendbuf, buf, length, &result);
  if(nread < 0) {
    if(result != CURLE_AGAIN)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    return NGHTTP2_ERR_DEFERRED;
  }
  if(ts->closed && Curl_bufq_is_empty(&ts->sendbuf))
    *data_flags = NGHTTP2_DATA_FLAG_EOF;

  CURL_TRC_CF(data, cf, "[%d] tunnel_send_callback -> %zd",
              ts->stream_id, nread);
  return nread;
}